

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

long test_drain_data_cb(cubeb_stream *param_1,void *user_ptr,void *input_buffer,void *output_buffer,
                       long frame_count)

{
  bool bVar1;
  char *pcVar2;
  int *in_RSI;
  long in_R8;
  int *cb_count;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined1 in_stack_ffffffffffffff6f;
  String *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff80;
  AssertHelper local_78;
  Message local_70;
  AssertionResult local_68;
  String local_58;
  AssertHelper local_48;
  Message local_40;
  AssertionResult local_38;
  long local_28;
  int *local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80.ptr_);
    testing::internal::GetBoolAssertionFailureMessage
              ((AssertionResult *)&local_58,&local_38.success_,"output_buffer","false");
    pcVar2 = testing::internal::String::c_str(&local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x1fa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::String::~String(in_stack_ffffffffffffff70);
    testing::Message::~Message((Message *)0x10a8ca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10a8d4);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80.ptr_);
    testing::internal::GetBoolAssertionFailureMessage
              ((AssertionResult *)&stack0xffffffffffffff78,&local_68.success_,"!input_buffer",
               "false");
    pcVar2 = testing::internal::String::c_str((String *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x1fb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::String::~String(in_stack_ffffffffffffff70);
    testing::Message::~Message((Message *)0x10a98a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10a994);
  *local_10 = *local_10 + 1;
  return local_28 + -1;
}

Assistant:

long test_drain_data_cb(cubeb_stream * /*stm*/, void * user_ptr,
                        const void * input_buffer,
                        void * output_buffer, long frame_count)
{
  EXPECT_TRUE(output_buffer);
  EXPECT_TRUE(!input_buffer);
  auto cb_count = static_cast<int *>(user_ptr);
  (*cb_count)++;
  return frame_count - 1;
}